

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_restoration(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  bool bVar2;
  int sn_00;
  int sn_01;
  int sn_02;
  int sn_03;
  
  sn_00 = skill_lookup("prevent healing");
  sn_01 = skill_lookup("forget");
  sn_02 = skill_lookup("wither");
  sn_03 = skill_lookup("undead drain");
  bVar1 = is_affected((CHAR_DATA *)vo,sn_01);
  if (bVar1) {
    send_to_char("You feel your mind becoming clearer.\n\r",(CHAR_DATA *)vo);
    act("$n looks less confused.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    switchD_002dea30::default((CHAR_DATA *)vo,sn_01);
  }
  bVar2 = is_affected((CHAR_DATA *)vo,sn_02);
  if (bVar2) {
    send_to_char("Your emaciated body is restored.\n\r",(CHAR_DATA *)vo);
    act("$n\'s emaciated body looks healthier.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    switchD_002dea30::default((CHAR_DATA *)vo,sn_02);
    bVar1 = true;
  }
  bVar2 = is_affected((CHAR_DATA *)vo,sn_00);
  if (bVar2) {
    send_to_char("You no longer feel so sickly and weary.\n\r",(CHAR_DATA *)vo);
    act("$n\'s sickly complexion clears up.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    switchD_002dea30::default((CHAR_DATA *)vo,sn_00);
    bVar1 = true;
  }
  bVar2 = is_affected((CHAR_DATA *)vo,(int)gsn_atrophy);
  if (bVar2) {
    act("$n\'s body stops wasting away.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    send_to_char("Your body stops wasting away.\n\r",(CHAR_DATA *)vo);
    switchD_002dea30::default((CHAR_DATA *)vo,(int)gsn_atrophy);
  }
  bVar2 = is_affected((CHAR_DATA *)vo,sn_03);
  if (bVar2) {
    bVar2 = check_dispel(level + 0xf,(CHAR_DATA *)vo,sn_03);
    if (bVar2) {
      act("$n looks much better.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
      switchD_002dea30::default((CHAR_DATA *)vo,sn_03);
      return;
    }
  }
  if (bVar1 != false) {
    return;
  }
  send_to_char("Spell had no effect.\n\r",ch);
  return;
}

Assistant:

void spell_restoration(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int sn_forget, sn_wither, sn_drain, sn_prevent_healing;
	bool success = false;

	sn_prevent_healing = skill_lookup("prevent healing");
	sn_forget = skill_lookup("forget");
	sn_wither = skill_lookup("wither");
	sn_drain = skill_lookup("undead drain");

	if (is_affected(victim, sn_forget))
	{
		send_to_char("You feel your mind becoming clearer.\n\r", victim);
		act("$n looks less confused.", victim, 0, 0, TO_ROOM);
		affect_strip(victim, sn_forget);
		success = true;
	}

	if (is_affected(victim, sn_wither))
	{
		send_to_char("Your emaciated body is restored.\n\r", victim);
		act("$n's emaciated body looks healthier.", victim, 0, 0, TO_ROOM);
		affect_strip(victim, sn_wither);
		success = true;
	}

	if (is_affected(victim, sn_prevent_healing))
	{
		send_to_char("You no longer feel so sickly and weary.\n\r", victim);
		act("$n's sickly complexion clears up.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, sn_prevent_healing);
		success = true;
	}

	if (is_affected(victim, gsn_atrophy))
	{
		act("$n's body stops wasting away.", victim, 0, 0, TO_ROOM);
		send_to_char("Your body stops wasting away.\n\r", victim);
		affect_strip(victim, gsn_atrophy);
	}

	if (is_affected(victim, sn_drain) && check_dispel(level + 15, victim, sn_drain))
	{
		act("$n looks much better.", victim, nullptr, nullptr, TO_ROOM);
		affect_strip(victim, sn_drain);
		success = true;
	}

	if (!success)
		send_to_char("Spell had no effect.\n\r", ch);
}